

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

bool __thiscall
cmWorkerPool::JobT::RunProcess
          (JobT *this,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *workingDirectory)

{
  bool bVar1;
  reference pvVar2;
  
  pvVar2 = std::
           vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
           ::at(&((this->Pool_->Int_)._M_t.
                  super___uniq_ptr_impl<cmWorkerPoolInternal,_std::default_delete<cmWorkerPoolInternal>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmWorkerPoolInternal_*,_std::default_delete<cmWorkerPoolInternal>_>
                  .super__Head_base<0UL,_cmWorkerPoolInternal_*,_false>._M_head_impl)->Workers,
                (ulong)this->WorkerIndex_);
  bVar1 = cmWorkerPoolWorker::RunProcess
                    ((pvVar2->_M_t).
                     super___uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>
                     .super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl,result,command
                     ,workingDirectory);
  return bVar1;
}

Assistant:

bool cmWorkerPool::JobT::RunProcess(ProcessResultT& result,
                                    std::vector<std::string> const& command,
                                    std::string const& workingDirectory)
{
  // Get worker by index
  auto* wrk = Pool_->Int_->Workers.at(WorkerIndex_).get();
  return wrk->RunProcess(result, command, workingDirectory);
}